

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.h
# Opt level: O3

void __thiscall ObjTypeSpecFldInfo::SetFieldValue(ObjTypeSpecFldInfo *this,Var value)

{
  Type *addr;
  FixedFieldIDL *pFVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  bVar3 = IsMono(this);
  if (!bVar3) {
    bVar3 = IsPoly(this);
    if (bVar3) {
      bVar3 = DoesntHaveEquivalence(this);
      if (!bVar3) goto LAB_005ff868;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.h"
                       ,0xa8,"(IsMono() || (IsPoly() && !DoesntHaveEquivalence()))",
                       "IsMono() || (IsPoly() && !DoesntHaveEquivalence())");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
LAB_005ff868:
  pFVar1 = (this->m_data).fixedFieldInfoArray.ptr;
  addr = &pFVar1->fieldValue;
  Memory::Recycler::WBSetBit((char *)addr);
  (pFVar1->fieldValue).ptr = value;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void SetFieldValue(Js::Var value)
    {
        Assert(IsMono() || (IsPoly() && !DoesntHaveEquivalence()));
        m_data.fixedFieldInfoArray[0].fieldValue = value;
    }